

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

SourceFile * __thiscall hdc::Driver::parseFile(Driver *this,string *path)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  double dVar2;
  string local_178 [32];
  string local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  string local_118 [36];
  undefined4 local_f4;
  string local_f0 [48];
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  Driver *local_80;
  SourceFile *file;
  Parser parser;
  string *path_local;
  Driver *this_local;
  
  parser._80_8_ = path;
  Parser::Parser((Parser *)&file);
  std::operator+((char *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "parsing file \'");
  dVar2 = (double)std::operator+(local_a0,(char *)local_c0);
  Logger::log(&this->logger,dVar2);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::string(local_f0,(string *)path);
  local_80 = (Driver *)Program::getSourceFile(&this->program,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  if (local_80 == (Driver *)0x0) {
    std::__cxx11::string::string(local_118,(string *)path);
    bVar1 = fileExists(this,(string *)local_118);
    std::__cxx11::string::~string(local_118);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Parser::setLogger((Parser *)&file,&this->logger);
      std::__cxx11::string::string(local_178,(string *)path);
      local_80 = (Driver *)Parser::read((Parser *)&file,(int)local_178,__buf,in_RCX);
      std::__cxx11::string::~string(local_178);
      Program::addSourceFile(&this->program,(SourceFile *)local_80);
      this_local = local_80;
    }
    else {
      std::operator+((char *)local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "couldn\'t find file or directory \'");
      dVar2 = (double)std::operator+(local_138,(char *)local_158);
      Logger::log(&this->logger,dVar2);
      std::__cxx11::string::~string((string *)local_138);
      std::__cxx11::string::~string(local_158);
      Logger::quit(&this->logger);
      this_local = (Driver *)0x0;
    }
  }
  else {
    this_local = local_80;
  }
  local_f4 = 1;
  Parser::~Parser((Parser *)&file);
  return (SourceFile *)this_local;
}

Assistant:

SourceFile* Driver::parseFile(std::string path) {
    Parser parser;
    SourceFile* file;

    logger.log(LOG_INTERNAL_DRIVER, "parsing file '" + path + "'");
    file = program.getSourceFile(path);

    if (file != nullptr) {
        return file;
    }

    if (!fileExists(path)) {
        logger.log(LOG_ERROR, "couldn't find file or directory '" + path + "'");
        logger.quit();
        return nullptr;
    }

    parser.setLogger(&logger);
    file = parser.read(path);
    program.addSourceFile(file);

    return file;
}